

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventHandler.cpp
# Opt level: O0

void __thiscall TgBot::EventHandler::handleMessage(EventHandler *this,Ptr *message)

{
  EventBroadcaster *pEVar1;
  bool bVar2;
  element_type *peVar3;
  unsigned_long *puVar4;
  shared_ptr<TgBot::Message> local_e8;
  shared_ptr<TgBot::Message> local_d8;
  shared_ptr<TgBot::Message> local_c8;
  string local_b8;
  string local_98 [8];
  string command;
  size_t atSymbolPosition;
  size_t spacePosition;
  size_t splitPosition;
  string local_58;
  shared_ptr<TgBot::Message> local_28;
  Ptr *local_18;
  Ptr *message_local;
  EventHandler *this_local;
  
  pEVar1 = this->_broadcaster;
  local_18 = message;
  message_local = (Ptr *)this;
  std::shared_ptr<TgBot::Message>::shared_ptr(&local_28,message);
  EventBroadcaster::broadcastAnyMessage(pEVar1,&local_28);
  std::shared_ptr<TgBot::Message>::~shared_ptr(&local_28);
  peVar3 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)message);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"/",(allocator *)((long)&splitPosition + 7));
  bVar2 = StringTools::startsWith(&peVar3->text,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&splitPosition + 7));
  if (bVar2) {
    peVar3 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)message);
    atSymbolPosition = std::__cxx11::string::find((char)peVar3 + -0x48,0x20);
    peVar3 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)message);
    command.field_2._8_8_ = std::__cxx11::string::find((char)peVar3 + -0x48,0x40);
    if (atSymbolPosition == 0xffffffffffffffff) {
      spacePosition = command.field_2._8_8_;
      if (command.field_2._8_8_ == 0xffffffffffffffff) {
        std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   message);
        spacePosition = std::__cxx11::string::size();
      }
    }
    else if (command.field_2._8_8_ == 0xffffffffffffffff) {
      spacePosition = atSymbolPosition;
    }
    else {
      puVar4 = std::min<unsigned_long>
                         (&atSymbolPosition,(unsigned_long *)(command.field_2._M_local_buf + 8));
      spacePosition = *puVar4;
    }
    peVar3 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)message);
    std::__cxx11::string::substr((ulong)local_98,(ulong)&peVar3->text);
    pEVar1 = this->_broadcaster;
    std::__cxx11::string::string((string *)&local_b8,local_98);
    std::shared_ptr<TgBot::Message>::shared_ptr(&local_c8,message);
    bVar2 = EventBroadcaster::broadcastCommand(pEVar1,&local_b8,&local_c8);
    std::shared_ptr<TgBot::Message>::~shared_ptr(&local_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pEVar1 = this->_broadcaster;
      std::shared_ptr<TgBot::Message>::shared_ptr(&local_d8,message);
      EventBroadcaster::broadcastUnknownCommand(pEVar1,&local_d8);
      std::shared_ptr<TgBot::Message>::~shared_ptr(&local_d8);
    }
    std::__cxx11::string::~string(local_98);
  }
  else {
    pEVar1 = this->_broadcaster;
    std::shared_ptr<TgBot::Message>::shared_ptr(&local_e8,message);
    EventBroadcaster::broadcastNonCommandMessage(pEVar1,&local_e8);
    std::shared_ptr<TgBot::Message>::~shared_ptr(&local_e8);
  }
  return;
}

Assistant:

void EventHandler::handleMessage(Message::Ptr message) const {
    _broadcaster.broadcastAnyMessage(message);

    if (StringTools::startsWith(message->text, "/")) {
        size_t splitPosition;
        size_t spacePosition = message->text.find(' ');
        size_t atSymbolPosition = message->text.find('@');
        if (spacePosition == string::npos) {
            if (atSymbolPosition == string::npos) {
                splitPosition = message->text.size();
            } else {
                splitPosition = atSymbolPosition;
            }
        } else if (atSymbolPosition == string::npos) {
            splitPosition = spacePosition;
        } else {
            splitPosition = std::min(spacePosition, atSymbolPosition);
        }
        std::string command = message->text.substr(1, splitPosition - 1);
        if (!_broadcaster.broadcastCommand(command, message)) {
            _broadcaster.broadcastUnknownCommand(message);
        }
    } else {
        _broadcaster.broadcastNonCommandMessage(message);
    }
}